

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_trace_scan_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_trace_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 (*pauVar1) [24];
  long *plVar2;
  undefined8 *puVar3;
  __m256i alVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  int *piVar8;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i b_12;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [24];
  undefined1 auVar12 [24];
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  parasail_result_t *ppVar18;
  __m256i *ptr;
  int64_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  ulong uVar19;
  __m256i *palVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  __m256i *palVar24;
  char *pcVar25;
  uint uVar26;
  __m256i *__return_storage_ptr__;
  ulong uVar27;
  char *__format;
  uint a_12;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  undefined8 uVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  ulong uVar36;
  int iVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  __m256i_64_t e;
  __m256i_64_t h;
  undefined1 in_stack_fffffffffffffcc0 [12];
  undefined4 in_stack_fffffffffffffccc;
  __m256i *palVar55;
  long lVar56;
  undefined4 in_stack_fffffffffffffcf0;
  __m256i *palVar57;
  __m256i local_2e0;
  int local_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  long lStack_238;
  long lStack_230;
  long lStack_228;
  undefined1 local_200 [32];
  long local_1a0;
  long lStack_198;
  long lStack_190;
  longlong local_a0 [4];
  longlong local_80 [10];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar25 = "profile";
  }
  else {
    pvVar6 = (profile->profile64).score;
    if (pvVar6 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar25 = "profile->profile64.score";
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar25 = "profile->matrix";
      }
      else {
        uVar5 = profile->s1Len;
        if ((int)uVar5 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar25 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar25 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar25 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar25 = "open";
        }
        else {
          if (-1 < gap) {
            uVar14 = uVar5 - 1;
            uVar33 = (ulong)uVar5 + 3 >> 2;
            uVar31 = CONCAT44(0,open);
            iVar21 = -open;
            iVar16 = ppVar7->min;
            uVar36 = 0x8000000000000000 - (long)iVar16;
            if (iVar16 != iVar21 && SBORROW4(iVar16,iVar21) == iVar16 + open < 0) {
              uVar36 = uVar31 | 0x8000000000000000;
            }
            lVar17 = (long)ppVar7->max;
            a_12 = (uint)uVar33;
            ppVar18 = parasail_result_new_trace(a_12,s2Len,0x20,0x20);
            if (ppVar18 != (parasail_result_t *)0x0) {
              ppVar18->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar18->flag | 0x4880402;
              ptr = parasail_memalign___m256i(0x20,uVar33);
              __return_storage_ptr__ = (__m256i *)(ulong)(s2Len + 1);
              ptr_00 = parasail_memalign_int64_t(0x20,(size_t)__return_storage_ptr__);
              ptr_01 = parasail_memalign___m256i(0x20,uVar33);
              ptr_02 = parasail_memalign___m256i(0x20,uVar33);
              ptr_03 = parasail_memalign___m256i(0x20,uVar33);
              if (ptr_03 != (__m256i *)0x0 &&
                  ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                  (ptr_00 != (int64_t *)0x0 && ptr != (__m256i *)0x0))) {
                iVar15 = s2Len + -1;
                iVar16 = -(int)(uVar14 / uVar33);
                iVar37 = iVar16 + 3;
                auVar46._8_4_ = open;
                auVar46._0_8_ = uVar31;
                auVar46._12_4_ = 0;
                auVar46._16_4_ = open;
                auVar46._20_4_ = 0;
                auVar46._24_4_ = open;
                auVar46._28_4_ = 0;
                uVar19 = CONCAT44(0,gap);
                auVar40._8_4_ = gap;
                auVar40._0_8_ = uVar19;
                auVar40._12_4_ = 0;
                auVar40._16_4_ = gap;
                auVar40._20_4_ = 0;
                auVar40._24_4_ = gap;
                auVar40._28_4_ = 0;
                uVar36 = uVar36 + 1;
                lVar22 = 0x7ffffffffffffffe - lVar17;
                lVar23 = (long)(int)-(a_12 * gap);
                auVar41._8_8_ = lVar23;
                auVar41._0_8_ = lVar23;
                auVar41._16_8_ = lVar23;
                auVar41._24_8_ = lVar23;
                auVar41 = vpblendd_avx2(auVar41,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
                auVar41 = vpaddq_avx2(ZEXT832(uVar36),auVar41);
                lVar23 = (long)iVar21;
                for (uVar27 = 0; uVar27 != uVar33; uVar27 = uVar27 + 1) {
                  lVar28 = lVar23;
                  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
                    lVar30 = lVar28;
                    if (s1_beg != 0) {
                      lVar30 = 0;
                    }
                    local_80[lVar29] = lVar30;
                    local_a0[lVar29] = lVar30 - uVar31;
                    lVar28 = lVar28 - uVar33 * uVar19;
                  }
                  palVar20 = ptr_02 + uVar27;
                  (*palVar20)[0] = local_80[0];
                  (*palVar20)[1] = local_80[1];
                  (*palVar20)[2] = local_80[2];
                  (*palVar20)[3] = local_80[3];
                  palVar20 = ptr + uVar27;
                  (*palVar20)[0] = local_a0[0];
                  (*palVar20)[1] = local_a0[1];
                  (*palVar20)[2] = local_a0[2];
                  (*palVar20)[3] = local_a0[3];
                  lVar23 = lVar23 - uVar19;
                }
                *ptr_00 = 0;
                for (palVar20 = (__m256i *)0x1; __return_storage_ptr__ != palVar20;
                    palVar20 = (__m256i *)((long)*palVar20 + 1)) {
                  iVar35 = 0;
                  if (s2_beg == 0) {
                    iVar35 = iVar21;
                  }
                  ptr_00[(long)palVar20] = (long)iVar35;
                  iVar21 = iVar21 - gap;
                }
                local_2e0 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar46)
                ;
                lVar23 = lVar22;
                lStack_238 = lVar22;
                lStack_230 = lVar22;
                lStack_228 = lVar22;
                for (uVar34 = a_12 - 1; -1 < (int)uVar34; uVar34 = uVar34 - 1) {
                  ptr_03[uVar34] = local_2e0;
                  local_2e0 = (__m256i)vpsubq_avx2((undefined1  [32])local_2e0,auVar40);
                  alVar4[1]._4_4_ = in_stack_fffffffffffffccc;
                  alVar4._0_12_ = in_stack_fffffffffffffcc0;
                  alVar4[2] = (longlong)ptr_00;
                  alVar4[3] = (longlong)ptr_02;
                  b[1] = lVar17;
                  b[0] = (longlong)ptr_03;
                  b[2]._0_4_ = in_stack_fffffffffffffcf0;
                  b[2]._4_4_ = iVar15;
                  b[3] = (longlong)ptr;
                  _mm256_min_epi64_rpl(__return_storage_ptr__,alVar4,b);
                }
                local_240 = (undefined4)lVar23;
                uStack_23c = (undefined4)((ulong)lVar23 >> 0x20);
                palVar20 = ptr_02 + (a_12 - 1);
                palVar24 = ptr_02 + (ulong)uVar14 % uVar33;
                lVar23 = uVar33 * 0x20;
                lVar17 = 0;
                local_200._8_8_ = uVar36;
                local_200._0_8_ = uVar36;
                local_200._16_8_ = uVar36;
                local_200._24_8_ = uVar36;
                auVar47 = ZEXT3264(local_200);
                uVar31 = 0;
                iVar21 = iVar15;
                while (uVar31 != (uint)s2Len) {
                  auVar42 = auVar47._0_32_;
                  alVar4 = *palVar20;
                  auVar39 = alVar4._0_16_;
                  auVar48._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar39;
                  auVar48._16_16_ = ZEXT116(0) * alVar4._16_16_ + ZEXT116(1) * auVar39;
                  auVar48 = vpalignr_avx2((undefined1  [32])alVar4,auVar48,8);
                  auVar43 = vpblendd_avx2(auVar48,ZEXT832((ulong)ptr_00[uVar31]),3);
                  iVar35 = ppVar7->mapper[(byte)s2[uVar31]];
                  local_260._8_8_ = uVar36;
                  local_260._0_8_ = uVar36;
                  local_260._16_8_ = uVar36;
                  local_260._24_8_ = uVar36;
                  auVar48 = vpsubq_avx2(local_260,(undefined1  [32])*ptr_03);
                  auVar47 = ZEXT3264(auVar48);
                  for (lVar28 = 0; lVar23 != lVar28; lVar28 = lVar28 + 0x20) {
                    auVar48 = *(undefined1 (*) [32])((long)*ptr_02 + lVar28);
                    auVar45 = vpsubq_avx2(auVar48,auVar46);
                    auVar44 = vpsubq_avx2(*(undefined1 (*) [32])((long)*ptr + lVar28),auVar40);
                    auVar44 = vpcmpgtq_avx2(auVar45,auVar44);
                    auVar53._8_8_ = 8;
                    auVar53._0_8_ = 8;
                    auVar53._16_8_ = 8;
                    auVar53._24_8_ = 8;
                    auVar54._8_8_ = 0x10;
                    auVar54._0_8_ = 0x10;
                    auVar54._16_8_ = 0x10;
                    auVar54._24_8_ = 0x10;
                    auVar44 = vblendvpd_avx(auVar54,auVar53,auVar44);
                    vpaddq_avx2(auVar47._0_32_,*(undefined1 (*) [32])((long)*ptr_03 + lVar28));
                    auVar43 = vpaddq_avx2(auVar43,*(undefined1 (*) [32])
                                                   ((long)pvVar6 +
                                                   lVar28 + (long)(int)(iVar35 * a_12) * 0x20));
                    *(undefined1 (*) [32])
                     ((long)((ppVar18->field_4).rowcols)->score_row + lVar28 + lVar17) = auVar44;
                    a[1]._4_4_ = iVar15;
                    a._0_12_ = in_stack_fffffffffffffcc0;
                    a[2] = (longlong)ptr_00;
                    a[3] = (longlong)ptr_02;
                    b_00[1] = lVar17;
                    b_00[0] = (longlong)ptr_03;
                    b_00[2]._0_4_ = in_stack_fffffffffffffcf0;
                    b_00[2]._4_4_ = iVar21;
                    b_00[3] = (longlong)ptr;
                    palVar55 = ptr_02;
                    palVar57 = ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a,b_00);
                    a_00[1]._4_4_ = iVar15;
                    a_00._0_12_ = in_stack_fffffffffffffcc0;
                    a_00[2] = (longlong)ptr_00;
                    a_00[3] = (longlong)palVar55;
                    b_01[1] = lVar17;
                    b_01[0] = (longlong)ptr_03;
                    b_01[2]._0_4_ = in_stack_fffffffffffffcf0;
                    b_01[2]._4_4_ = iVar21;
                    b_01[3] = (longlong)palVar57;
                    _mm256_min_epi64_rpl(__return_storage_ptr__,a_00,b_01);
                    a_01[1]._4_4_ = iVar15;
                    a_01._0_12_ = in_stack_fffffffffffffcc0;
                    a_01[2] = (longlong)ptr_00;
                    a_01[3] = (longlong)palVar55;
                    b_02[1] = lVar17;
                    b_02[0] = (longlong)ptr_03;
                    b_02[2]._0_4_ = in_stack_fffffffffffffcf0;
                    b_02[2]._4_4_ = iVar21;
                    b_02[3] = (longlong)palVar57;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_01,b_02);
                    auVar47 = ZEXT3264(auVar45);
                    a_02[1]._4_4_ = iVar15;
                    a_02._0_12_ = in_stack_fffffffffffffcc0;
                    a_02[2] = (longlong)ptr_00;
                    a_02[3] = (longlong)palVar55;
                    b_03[1] = lVar17;
                    b_03[0] = (longlong)ptr_03;
                    b_03[2]._0_4_ = in_stack_fffffffffffffcf0;
                    b_03[2]._4_4_ = iVar21;
                    b_03[3] = (longlong)palVar57;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_02,b_03);
                    local_280._0_8_ = auVar45._0_8_;
                    local_280._8_8_ = auVar45._8_8_;
                    local_280._16_8_ = auVar45._16_8_;
                    local_280._24_8_ = auVar45._24_8_;
                    puVar3 = (undefined8 *)((long)*ptr + lVar28);
                    *puVar3 = local_280._0_8_;
                    puVar3[1] = local_280._8_8_;
                    puVar3[2] = local_280._16_8_;
                    puVar3[3] = local_280._24_8_;
                    *(undefined1 (*) [32])((long)*ptr_01 + lVar28) = auVar47._0_32_;
                    local_2e0[0] = auVar43._0_8_;
                    local_2e0[1] = auVar43._8_8_;
                    local_2e0[2] = auVar43._16_8_;
                    local_2e0[3] = auVar43._24_8_;
                    puVar3 = (undefined8 *)((long)*ptr_02 + lVar28);
                    *puVar3 = local_2e0[0];
                    puVar3[1] = local_2e0[1];
                    puVar3[2] = local_2e0[2];
                    puVar3[3] = local_2e0[3];
                    auVar43 = auVar48;
                    ptr_02 = palVar55;
                    ptr = palVar57;
                  }
                  auVar48 = vpermq_avx2(auVar47._0_32_,0x90);
                  auVar48 = vpblendd_avx2(auVar48,ZEXT832((ulong)ptr_00[uVar31 + 1]),3);
                  vpaddq_avx2(auVar48,(undefined1  [32])*ptr_03);
                  auVar47 = ZEXT3264(local_260);
                  a_03[1]._4_4_ = iVar15;
                  a_03._0_12_ = in_stack_fffffffffffffcc0;
                  a_03[2] = (longlong)ptr_00;
                  a_03[3] = (longlong)ptr_02;
                  b_04[1] = lVar17;
                  b_04[0] = (longlong)ptr_03;
                  b_04[2]._0_4_ = in_stack_fffffffffffffcf0;
                  b_04[2]._4_4_ = iVar21;
                  b_04[3] = (longlong)ptr;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_03,b_04);
                  iVar35 = 2;
                  while( true ) {
                    auVar43 = auVar47._0_32_;
                    auVar48 = vperm2i128_avx2(auVar43,auVar43,8);
                    auVar48 = vpalignr_avx2(auVar43,auVar48,8);
                    bVar38 = iVar35 == 0;
                    iVar35 = iVar35 + -1;
                    if (bVar38) break;
                    vpaddq_avx2(auVar48,auVar41);
                    a_04[1]._4_4_ = iVar15;
                    a_04._0_12_ = in_stack_fffffffffffffcc0;
                    a_04[2] = (longlong)ptr_00;
                    a_04[3] = (longlong)ptr_02;
                    b_05[1] = lVar17;
                    b_05[0] = (longlong)ptr_03;
                    b_05[2]._0_4_ = in_stack_fffffffffffffcf0;
                    b_05[2]._4_4_ = iVar21;
                    b_05[3] = (longlong)ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_04,b_05);
                  }
                  local_2e0 = (__m256i)vpaddq_avx2(auVar48,ZEXT832(uVar36));
                  a_05[1]._4_4_ = iVar15;
                  a_05._0_12_ = in_stack_fffffffffffffcc0;
                  a_05[2] = (longlong)ptr_00;
                  a_05[3] = (longlong)ptr_02;
                  b_06[1] = lVar17;
                  b_06[0] = (longlong)ptr_03;
                  b_06[2]._0_4_ = in_stack_fffffffffffffcf0;
                  b_06[2]._4_4_ = iVar21;
                  b_06[3] = (longlong)ptr;
                  local_280 = (undefined1  [32])local_2e0;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_05,b_06);
                  for (lVar28 = 0; lVar23 != lVar28; lVar28 = lVar28 + 0x20) {
                    piVar8 = ((ppVar18->field_4).rowcols)->score_row;
                    pauVar1 = (undefined1 (*) [24])((long)*ptr_02 + lVar28);
                    auVar11 = *pauVar1;
                    lVar29 = *(long *)pauVar1[1];
                    pauVar1 = (undefined1 (*) [24])((long)*ptr_01 + lVar28);
                    auVar12 = *pauVar1;
                    lVar30 = *(long *)pauVar1[1];
                    auVar44 = vpsubq_avx2(local_280,auVar46);
                    auVar48 = vpsubq_avx2((undefined1  [32])local_2e0,auVar40);
                    auVar48 = vpcmpgtq_avx2(auVar44,auVar48);
                    auVar43._8_8_ = 0x20;
                    auVar43._0_8_ = 0x20;
                    auVar43._16_8_ = 0x20;
                    auVar43._24_8_ = 0x20;
                    auVar52._8_8_ = 0x40;
                    auVar52._0_8_ = 0x40;
                    auVar52._16_8_ = 0x40;
                    auVar52._24_8_ = 0x40;
                    auVar48 = vblendvpd_avx(auVar52,auVar43,auVar48);
                    auVar43 = vorpd_avx(auVar48,*(undefined1 (*) [32])
                                                 ((long)piVar8 + lVar28 + lVar17));
                    a_06[1]._4_4_ = iVar15;
                    a_06._0_12_ = in_stack_fffffffffffffcc0;
                    a_06[2] = (longlong)ptr_00;
                    a_06[3] = (longlong)ptr_02;
                    b_07[1] = lVar17;
                    b_07[0] = (longlong)ptr_03;
                    b_07[2]._0_4_ = in_stack_fffffffffffffcf0;
                    b_07[2]._4_4_ = iVar21;
                    b_07[3] = (longlong)ptr;
                    palVar55 = ptr_02;
                    lVar56 = lVar17;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_06,b_07);
                    local_1a0 = auVar12._0_8_;
                    lStack_198 = auVar12._8_8_;
                    lStack_190 = auVar12._16_8_;
                    a_07[1]._4_4_ = iVar15;
                    a_07._0_12_ = in_stack_fffffffffffffcc0;
                    a_07[2] = (longlong)ptr_00;
                    a_07[3] = (longlong)palVar55;
                    b_08[1] = lVar56;
                    b_08[0] = (longlong)ptr_03;
                    b_08[2]._0_4_ = in_stack_fffffffffffffcf0;
                    b_08[2]._4_4_ = iVar21;
                    b_08[3] = (longlong)ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_07,b_08);
                    local_280._8_8_ = lStack_198;
                    local_280._0_8_ = local_1a0;
                    local_280._16_8_ = lStack_190;
                    local_280._24_8_ = lVar30;
                    local_260._0_8_ = auVar11._0_8_;
                    auVar45._0_8_ = -(ulong)(local_1a0 == local_260._0_8_);
                    local_260._8_8_ = auVar11._8_8_;
                    auVar45._8_8_ = -(ulong)(lStack_198 == local_260._8_8_);
                    auVar45._16_8_ = -(ulong)(lStack_190 == auVar11._16_8_);
                    auVar45._24_8_ = -(ulong)(lVar30 == lVar29);
                    local_2e0[0] = auVar44._0_8_;
                    auVar49._0_8_ = -(ulong)(local_1a0 == local_2e0[0]);
                    local_2e0[1] = auVar44._8_8_;
                    auVar49._8_8_ = -(ulong)(lStack_198 == local_2e0[1]);
                    auVar49._16_8_ = -(ulong)(lStack_190 == auVar44._16_8_);
                    local_2e0[3] = auVar44._24_8_;
                    auVar49._24_8_ = -(ulong)(lVar30 == local_2e0[3]);
                    auVar50._8_8_ = 1;
                    auVar50._0_8_ = 1;
                    auVar50._16_8_ = 1;
                    auVar50._24_8_ = 1;
                    auVar48 = vpsubq_avx2(auVar50,auVar49);
                    auVar51._8_8_ = 4;
                    auVar51._0_8_ = 4;
                    auVar51._16_8_ = 4;
                    auVar51._24_8_ = 4;
                    auVar48 = vblendvpd_avx(auVar48,auVar51,auVar45);
                    auVar48 = vorpd_avx(auVar48,auVar43);
                    *(undefined1 (*) [32])((long)piVar8 + lVar28 + lVar17) = auVar48;
                    plVar2 = (long *)((long)*ptr_02 + lVar28);
                    *plVar2 = local_1a0;
                    plVar2[1] = lStack_198;
                    plVar2[2] = lStack_190;
                    plVar2[3] = lVar30;
                    a_08[1]._4_4_ = iVar15;
                    a_08._0_12_ = in_stack_fffffffffffffcc0;
                    a_08[2] = (longlong)ptr_00;
                    a_08[3] = (longlong)palVar55;
                    b_09[1] = lVar56;
                    b_09[0] = (longlong)ptr_03;
                    b_09[2]._0_4_ = in_stack_fffffffffffffcf0;
                    b_09[2]._4_4_ = iVar21;
                    b_09[3] = (longlong)ptr;
                    _mm256_min_epi64_rpl(__return_storage_ptr__,a_08,b_09);
                    a_09[1]._4_4_ = iVar15;
                    a_09._0_12_ = in_stack_fffffffffffffcc0;
                    a_09[2] = (longlong)ptr_00;
                    a_09[3] = (longlong)palVar55;
                    b_10[1] = lVar56;
                    b_10[0] = (longlong)ptr_03;
                    b_10[2]._0_4_ = in_stack_fffffffffffffcf0;
                    b_10[2]._4_4_ = iVar21;
                    b_10[3] = (longlong)ptr;
                    _mm256_min_epi64_rpl(__return_storage_ptr__,a_09,b_10);
                    a_10[1]._4_4_ = iVar15;
                    a_10._0_12_ = in_stack_fffffffffffffcc0;
                    a_10[2] = (longlong)ptr_00;
                    a_10[3] = (longlong)palVar55;
                    b_11[1] = lVar56;
                    b_11[0] = (longlong)ptr_03;
                    b_11[2]._0_4_ = in_stack_fffffffffffffcf0;
                    b_11[2]._4_4_ = iVar21;
                    b_11[3] = (longlong)ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_10,b_11);
                    ptr_02 = palVar55;
                    lVar17 = lVar56;
                    local_2e0 = (__m256i)auVar44;
                  }
                  alVar4 = *palVar24;
                  auVar47 = ZEXT3264((undefined1  [32])alVar4);
                  auVar48 = vpcmpgtq_avx2((undefined1  [32])alVar4,auVar42);
                  a_11[1]._4_4_ = iVar15;
                  a_11._0_12_ = in_stack_fffffffffffffcc0;
                  a_11[2] = (longlong)ptr_00;
                  a_11[3] = (longlong)ptr_02;
                  b_12[1] = lVar17;
                  b_12[0] = (longlong)ptr_03;
                  b_12[2]._0_4_ = in_stack_fffffffffffffcf0;
                  b_12[2]._4_4_ = iVar21;
                  b_12[3] = (longlong)ptr;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_11,b_12);
                  auVar42._8_8_ = -(ulong)(iVar37 == 2);
                  auVar42._0_8_ = -(ulong)(iVar37 == 3);
                  auVar42._16_8_ = -(ulong)(iVar37 == 1);
                  auVar42._24_8_ = -(ulong)(iVar16 == -3);
                  auVar42 = auVar42 & auVar48;
                  local_288 = (int)uVar31;
                  if ((((auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar42 >> 0x7f,0) != '\0') || SUB321(auVar42 >> 0xbf,0) != '\0') ||
                      auVar42[0x1f] < '\0') {
                    iVar15 = local_288;
                  }
                  lVar17 = lVar17 + lVar23;
                  uVar31 = uVar31 + 1;
                }
                uVar31 = uVar36;
                if (s2_end != 0) {
                  for (iVar16 = 0; iVar16 < iVar37; iVar16 = iVar16 + 1) {
                    auVar46 = auVar47._0_32_;
                    auVar41 = vperm2i128_avx2(auVar46,auVar46,8);
                    auVar41 = vpalignr_avx2(auVar46,auVar41,8);
                    auVar47 = ZEXT3264(auVar41);
                  }
                  uVar31 = vpextrq_avx(auVar47._16_16_,1);
                }
                uVar34 = uVar14;
                if (s1_end != 0) {
                  for (uVar33 = 0; (a_12 & 0x1fffffff) << 2 != (uint)uVar33; uVar33 = uVar33 + 1) {
                    uVar26 = ((uint)uVar33 & 3) * a_12 + ((uint)(uVar33 >> 2) & 0x3fffffff);
                    uVar19 = uVar31;
                    iVar16 = iVar15;
                    uVar13 = uVar34;
                    if (((int)uVar26 < (int)uVar5) &&
                       (uVar19 = (*ptr_02)[uVar33], iVar16 = iVar21, uVar13 = uVar26,
                       (long)uVar19 <= (long)uVar31)) {
                      if ((int)uVar34 <= (int)uVar26) {
                        uVar26 = uVar34;
                      }
                      if (iVar15 != iVar21) {
                        uVar26 = uVar34;
                      }
                      bVar38 = uVar19 == uVar31;
                      uVar19 = uVar31;
                      iVar16 = iVar15;
                      uVar13 = uVar34;
                      if (bVar38) {
                        uVar13 = uVar26;
                      }
                    }
                    uVar34 = uVar13;
                    iVar15 = iVar16;
                    uVar31 = uVar19;
                  }
                }
                iVar16 = (int)uVar31;
                if (s2_end == 0 && s1_end == 0) {
                  alVar4 = *palVar24;
                  for (iVar16 = 0; iVar16 < iVar37; iVar16 = iVar16 + 1) {
                    auVar41 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                    alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar41,8);
                  }
                  uVar32 = vpextrq_avx(alVar4._16_16_,1);
                  iVar16 = (int)uVar32;
                  iVar15 = iVar21;
                  uVar34 = uVar14;
                }
                auVar9._8_8_ = uVar36;
                auVar9._0_8_ = uVar36;
                auVar9._16_8_ = uVar36;
                auVar9._24_8_ = uVar36;
                auVar44._4_4_ = uStack_23c;
                auVar44._0_4_ = local_240;
                auVar44._8_8_ = lStack_238;
                auVar44._16_8_ = lStack_230;
                auVar44._24_8_ = lStack_228;
                auVar41 = vpcmpgtq_avx2(auVar9,auVar44);
                auVar10._8_8_ = lVar22;
                auVar10._0_8_ = lVar22;
                auVar10._16_8_ = lVar22;
                auVar10._24_8_ = lVar22;
                auVar46 = vpcmpgtq_avx2(local_200,auVar10);
                auVar41 = vpor_avx2(auVar41,auVar46);
                if ((((auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar41 >> 0x7f,0) != '\0') || SUB321(auVar41 >> 0xbf,0) != '\0') ||
                    auVar41[0x1f] < '\0') {
                  *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
                  iVar16 = 0;
                  iVar15 = 0;
                  uVar34 = 0;
                }
                ppVar18->score = iVar16;
                ppVar18->end_query = uVar34;
                ppVar18->end_ref = iVar15;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar18;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar25 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_trace_scan_profile_avx2_256_64",pcVar25);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;
    __m256i vTIns;
    __m256i vTDel;
    __m256i vTDiag;
    __m256i vTDiagE;
    __m256i vTInsE;
    __m256i vTDiagF;
    __m256i vTDelF;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));
    vTIns  = _mm256_set1_epi64x_rpl(PARASAIL_INS);
    vTDel  = _mm256_set1_epi64x_rpl(PARASAIL_DEL);
    vTDiag = _mm256_set1_epi64x_rpl(PARASAIL_DIAG);
    vTDiagE= _mm256_set1_epi64x_rpl(PARASAIL_DIAG_E);
    vTInsE = _mm256_set1_epi64x_rpl(PARASAIL_INS_E);
    vTDiagF= _mm256_set1_epi64x_rpl(PARASAIL_DIAG_F);
    vTDelF = _mm256_set1_epi64x_rpl(PARASAIL_DEL_F);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 32, sizeof(__m256i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vHt;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vT;
        __m256i vET;
        __m256i vFT;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vE_opn = _mm256_sub_epi64(vH, vGapO);
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vET = _mm256_blendv_epi8(vTInsE, vTDiagE, case1);
            arr_store(result->trace->trace_table, vET, i, segLen, j);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vGapper = _mm256_add_epi64(vHt, vGapper);
            vF = _mm256_max_epi64_rpl(vF, vGapper);
            vHp = _mm256_add_epi64(vHp, vW);
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            _mm256_store_si256(pvH+i, vHp);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapper = _mm256_add_epi64(vHt, vGapper);
        vF = _mm256_max_epi64_rpl(vF, vGapper);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vF, vHt);
        for (i=0; i<segLen; ++i) {
            vET = arr_load(result->trace->trace_table, i, segLen, j);
            vHp = _mm256_load_si256(pvH+i);
            vHt = _mm256_load_si256(pvHt+i);
            vF_opn = _mm256_sub_epi64(vH, vGapO);
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFT = _mm256_blendv_epi8(vTDelF, vTDiagF, case1);
            vH = _mm256_max_epi64_rpl(vHt, vF);
            case1 = _mm256_cmpeq_epi64(vH, vHp);
            case2 = _mm256_cmpeq_epi64(vH, vF);
            vT = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vTIns, vTDel, case2),
                    vTDiag, case1);
            vT = _mm256_or_si256(vT, vET);
            vT = _mm256_or_si256(vT, vFT);
            arr_store(result->trace->trace_table, vT, i, segLen, j);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
        }

        /* extract vector containing last value from column */
        {
            __m256i vCompare;
            vH = _mm256_load_si256(pvH + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
        }
    } 

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}